

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall Units::Units(Units *this)

{
  long lVar1;
  
  lVar1 = 0x58;
  do {
    *(long *)((long)this->factors + lVar1 + -0x10) = (long)this->factors + lVar1;
    *(undefined8 *)((long)this->factors + lVar1 + -8) = 0;
    *(undefined1 *)((long)this->factors + lVar1) = 0;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x178);
  this->factors[5] = 448.831;
  std::__cxx11::string::assign((char *)(this->names + 5));
  this->factors[4] = 0.4333;
  std::__cxx11::string::assign((char *)(this->names + 4));
  this->factors[8] = 0.0353145;
  std::__cxx11::string::assign((char *)(this->names + 8));
  setOtherFactors(this,0);
  return;
}

Assistant:

Units::Units()
{
    // ... conversion factors for default US units
    factors[FLOW]     = GPMperCFS;
    names[FLOW]       = "gpm";
    factors[PRESSURE] = PSIperFT;
    names[PRESSURE]   = "psi";
    factors[CONCEN]   = FT3perL;
    names[CONCEN]     = "mg/L";
    setOtherFactors(Options::US);
}